

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::matrix4d>
          (GeomPrimvar *this,double timecode,matrix4d *dest,TimeSampleInterpolationType interp,
          string *err)

{
  bool bVar1;
  uint32_t tyid;
  string *args;
  long lVar2;
  matrix4d *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Attribute *this_00;
  byte bVar4;
  allocator local_129;
  double local_128;
  double timecode_local;
  undefined4 local_114;
  string local_110;
  string local_f0;
  string local_d0;
  matrix4d value;
  
  bVar4 = 0;
  timecode_local = timecode;
  if (dest != (matrix4d *)0x0) {
    this_00 = &this->_attr;
    args = err;
    local_128 = timecode;
    bVar1 = Attribute::is_blocked(this_00);
    if (!bVar1) {
      tyid = Attribute::type_id(this_00);
      bVar1 = IsSupportedGeomPrimvarType(tyid);
      if (!bVar1) {
        if (err == (string *)0x0) {
          return false;
        }
        std::__cxx11::string::string
                  ((string *)&local_d0,"Unsupported type for GeomPrimvar. type = `{}`",
                   (allocator *)&local_110);
        Attribute::type_name_abi_cxx11_(&local_f0,this_00);
        fmt::format<std::__cxx11::string>((string *)&value,(fmt *)&local_d0,&local_f0,args);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return false;
      }
      value.m[0][0] = 1.0;
      value.m[0][1] = 0.0;
      value.m[0][2] = 0.0;
      value.m[0][3] = 0.0;
      value.m[1][0] = 0.0;
      value.m[1][1] = 1.0;
      value.m[1][2] = 0.0;
      value.m[1][3] = 0.0;
      value.m[2][0] = 0.0;
      value.m[2][1] = 0.0;
      value.m[2][2] = 1.0;
      value.m[2][3] = 0.0;
      value.m[3][0] = 0.0;
      value.m[3][1] = 0.0;
      value.m[3][2] = 0.0;
      value.m[3][3] = 1.0;
      bVar1 = Attribute::get<tinyusdz::value::matrix4d>(this_00,local_128,&value,interp);
      if (bVar1) {
        pmVar3 = &value;
        for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
          dest->m[0][0] = pmVar3->m[0][0];
          pmVar3 = (matrix4d *)((long)pmVar3 + ((ulong)bVar4 * -2 + 1) * 8);
          dest = (matrix4d *)((long)dest + ((ulong)bVar4 * -2 + 1) * 8);
        }
        return bVar1;
      }
      if (err != (string *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_f0,
                   "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                   ,&local_129);
        local_114 = 0x38;
        Attribute::type_name_abi_cxx11_(&local_110,this_00);
        fmt::format<double,unsigned_int,std::__cxx11::string>
                  (&local_d0,(fmt *)&local_f0,(string *)&timecode_local,(double *)&local_114,
                   (uint *)&local_110,in_R9);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return bVar1;
      }
      return bVar1;
    }
  }
  if (err != (string *)0x0) {
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}